

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_delay.c
# Opt level: O1

t_int * sigdelread_perform(t_int *w)

{
  uint uVar1;
  t_int tVar2;
  uint *puVar3;
  long lVar4;
  long lVar5;
  undefined4 *puVar6;
  long lVar7;
  long lVar8;
  
  tVar2 = w[4];
  if ((int)tVar2 != 0) {
    puVar3 = (uint *)w[2];
    uVar1 = *puVar3;
    lVar4 = *(long *)(puVar3 + 2);
    lVar5 = w[1];
    puVar6 = (undefined4 *)
             (lVar4 + (long)(int)(((int)(puVar3[4] - *(int *)w[3]) >> 0x1f & uVar1) +
                                 (puVar3[4] - *(int *)w[3])) * 4);
    lVar7 = 0;
    do {
      lVar8 = 0;
      if (puVar6 + 1 == (undefined4 *)(lVar4 + (long)(int)uVar1 * 4 + 0x10)) {
        lVar8 = -(long)(int)uVar1;
      }
      *(undefined4 *)(lVar5 + lVar7 * 4) = *puVar6;
      puVar6 = puVar6 + lVar8 + 1;
      lVar7 = lVar7 + 1;
    } while ((int)tVar2 != (int)lVar7);
  }
  return w + 5;
}

Assistant:

static t_int *sigdelread_perform(t_int *w)
{
    t_sample *out = (t_sample *)(w[1]);
    t_delwritectl *c = (t_delwritectl *)(w[2]);
    int delsamps = *(int *)(w[3]);
    int n = (int)(w[4]);
    int phase = c->c_phase - delsamps, nsamps = c->c_n;
    t_sample *vp = c->c_vec, *bp, *ep = vp + (c->c_n + XTRASAMPS);
    if (phase < 0) phase += nsamps;
    bp = vp + phase;

    while (n--)
    {
        *out++ = *bp++;
        if (bp == ep) bp -= nsamps;
    }
    return (w+5);
}